

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t::stat_impl<false>
          (data_t *this,uint64_t *count,
          vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
          *result,int i)

{
  __pointer_type paVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  ushort local_3a;
  __int_type_conflict value;
  
  paVar1 = (this->arr)._M_elems[i]._M_b._M_p;
  if (paVar1 != (__pointer_type)0x0) {
    iVar4 = i * -0x80 + 0x1f80;
    for (lVar3 = 0x7f; lVar3 != -1 && -1 < lVar3 + 1; lVar3 = lVar3 + -1) {
      value = paVar1->_M_elems[lVar3].super___atomic_base<unsigned_long>._M_i;
      if (value != 0) {
        uVar2 = (short)lVar3 + (short)i * 0x80;
        local_3a = (ushort)iVar4;
        if (uVar2 < 0x2000) {
          local_3a = uVar2;
        }
        std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
        emplace_back<unsigned_short,unsigned_long&>
                  ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
                    *)result,&local_3a,&value);
        *count = *count + value;
      }
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void stat_impl(uint64_t& count,
                   std::vector<std::pair<int16_t, uint_type>>& result, int i) {
      auto piece = arr[i].load(std::memory_order_relaxed);
      if (piece) {
        if constexpr (inc_order) {
          for (int j = 0; j < piece->size(); ++j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
        else {
          for (int j = piece->size() - 1; j >= 0; --j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
      }
    }